

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O1

int ecp_mod_p256(mbedtls_mpi *N)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  mbedtls_mpi_uint mVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  char cVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  mbedtls_mpi C;
  mbedtls_mpi_uint Cp [5];
  uint local_80;
  mbedtls_mpi local_70;
  mbedtls_mpi_uint local_58 [5];
  
  local_70.s = 1;
  local_70.n = 5;
  local_70.p = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  iVar5 = mbedtls_mpi_grow(N,8);
  if (iVar5 == 0) {
    pmVar2 = N->p;
    mVar3 = *pmVar2;
    uVar7 = pmVar2[4];
    uVar4 = (uint)uVar7;
    uVar14 = (uint)mVar3;
    uVar22 = uVar4 + uVar14;
    uVar13 = (uint)(uVar7 >> 0x20);
    uVar23 = uVar22 + uVar13;
    uVar6 = (uint)(pmVar2[5] >> 0x20);
    uVar24 = uVar23 - uVar6;
    uVar9 = (uint)pmVar2[6];
    uVar25 = uVar24 - uVar9;
    uVar10 = (uint)(pmVar2[6] >> 0x20);
    uVar26 = uVar25 - uVar10;
    uVar15 = (uint)pmVar2[7];
    iVar27 = uVar26 - uVar15;
    cVar20 = ((((CARRY4(uVar22,uVar13) + CARRY4(uVar4,uVar14)) - (uVar23 < uVar6)) -
              (uVar24 < uVar9)) - (uVar25 < uVar10)) - (uVar26 < uVar15);
    *(int *)pmVar2 = iVar27;
    uVar22 = (uint)cVar20;
    uVar14 = (uint)(mVar3 >> 0x20);
    if (cVar20 < '\0') {
      cVar20 = -(uVar14 < -uVar22);
    }
    else {
      cVar20 = CARRY4(uVar22,uVar14);
    }
    uVar23 = uVar22 + uVar14 + uVar13;
    local_80 = (uint)pmVar2[5];
    uVar24 = uVar23 + local_80;
    uVar25 = uVar24 - uVar9;
    uVar26 = uVar25 - uVar10;
    uVar16 = uVar26 - uVar15;
    uVar21 = (uint)(pmVar2[7] >> 0x20);
    cVar20 = ((((CARRY4(uVar22 + uVar14,uVar13) + cVar20 + CARRY4(uVar23,local_80)) -
               (uVar24 < uVar9)) - (uVar25 < uVar10)) - (uVar26 < uVar15)) - (uVar16 < uVar21);
    *pmVar2 = CONCAT44(uVar16 - uVar21,iVar27);
    uVar11 = pmVar2[1];
    uVar22 = (uint)cVar20;
    uVar14 = (uint)uVar11;
    if (cVar20 < '\0') {
      cVar20 = -(uVar14 < -uVar22);
    }
    else {
      cVar20 = CARRY4(uVar22,uVar14);
    }
    uVar23 = uVar22 + uVar14 + local_80;
    uVar24 = uVar23 + uVar6;
    uVar25 = uVar24 - uVar10;
    uVar26 = uVar25 - uVar15;
    uVar16 = uVar26 - uVar21;
    cVar20 = (((CARRY4(uVar22 + uVar14,local_80) + cVar20 + CARRY4(uVar23,uVar6)) -
              (uVar24 < uVar10)) - (uVar25 < uVar15)) - (uVar26 < uVar21);
    pmVar2[1] = uVar11 & 0xffffffff00000000 | (ulong)uVar16;
    uVar22 = (uint)cVar20;
    uVar14 = (uint)(uVar11 >> 0x20);
    if (cVar20 < '\0') {
      cVar20 = -(uVar14 < -uVar22);
    }
    else {
      cVar20 = CARRY4(uVar22,uVar14);
    }
    uVar23 = uVar22 + uVar14 + uVar6;
    uVar24 = uVar23 + uVar6;
    uVar25 = uVar24 + uVar9;
    uVar26 = uVar25 + uVar9;
    uVar17 = uVar26 + uVar10;
    uVar18 = uVar17 - uVar21;
    uVar19 = uVar18 - uVar4;
    cVar20 = (((CARRY4(uVar25,uVar9) +
                CARRY4(uVar23,uVar6) + cVar20 + CARRY4(uVar22 + uVar14,uVar6) + CARRY4(uVar24,uVar9)
               + CARRY4(uVar26,uVar10)) - (uVar17 < uVar21)) - (uVar18 < uVar4)) - (uVar19 < uVar13)
    ;
    pmVar2[1] = CONCAT44(uVar19 - uVar13,uVar16);
    uVar11 = pmVar2[2];
    uVar22 = (uint)cVar20;
    uVar14 = (uint)uVar11;
    if (cVar20 < '\0') {
      cVar20 = -(uVar14 < -uVar22);
    }
    else {
      cVar20 = CARRY4(uVar22,uVar14);
    }
    uVar23 = uVar22 + uVar14 + uVar9;
    uVar24 = uVar23 + uVar9;
    uVar25 = uVar24 + uVar10;
    uVar26 = uVar25 + uVar10;
    uVar16 = uVar26 + uVar15;
    uVar17 = uVar16 - uVar13;
    uVar18 = uVar17 - local_80;
    cVar20 = ((CARRY4(uVar25,uVar10) +
               CARRY4(uVar23,uVar9) + cVar20 + CARRY4(uVar22 + uVar14,uVar9) + CARRY4(uVar24,uVar10)
              + CARRY4(uVar26,uVar15)) - (uVar16 < uVar13)) - (uVar17 < local_80);
    pmVar2[2] = uVar11 & 0xffffffff00000000 | (ulong)uVar18;
    uVar22 = (uint)cVar20;
    uVar14 = (uint)(uVar11 >> 0x20);
    if (cVar20 < '\0') {
      cVar20 = -(uVar14 < -uVar22);
    }
    else {
      cVar20 = CARRY4(uVar22,uVar14);
    }
    uVar23 = uVar22 + uVar14 + uVar10;
    uVar24 = uVar23 + uVar10;
    uVar25 = uVar24 + uVar15;
    uVar26 = uVar25 + uVar15;
    uVar16 = uVar26 + uVar21;
    uVar17 = uVar16 - local_80;
    cVar20 = ((CARRY4(uVar25,uVar15) +
               CARRY4(uVar23,uVar10) + cVar20 + CARRY4(uVar22 + uVar14,uVar10) +
               CARRY4(uVar24,uVar15) + CARRY4(uVar26,uVar21)) - (uVar16 < local_80)) -
             (uVar17 < uVar6);
    pmVar2[2] = CONCAT44(uVar17 - uVar6,uVar18);
    uVar11 = pmVar2[3];
    uVar22 = (uint)cVar20;
    uVar14 = (uint)uVar11;
    if (cVar20 < '\0') {
      cVar20 = -(uVar14 < -uVar22);
    }
    else {
      cVar20 = CARRY4(uVar22,uVar14);
    }
    uVar23 = uVar22 + uVar14 + uVar15;
    uVar24 = uVar23 + uVar15;
    uVar25 = uVar24 + uVar21;
    uVar26 = uVar25 + uVar21;
    uVar16 = uVar26 + uVar15;
    uVar17 = uVar16 + uVar10;
    uVar18 = uVar17 - uVar4;
    uVar19 = uVar18 - uVar13;
    cVar20 = ((CARRY4(uVar26,uVar15) +
               CARRY4(uVar24,uVar21) +
               CARRY4(uVar22 + uVar14,uVar15) + cVar20 + CARRY4(uVar23,uVar15) +
               CARRY4(uVar25,uVar21) + CARRY4(uVar16,uVar10)) - (uVar17 < uVar4)) -
             (uVar18 < uVar13);
    pmVar2[3] = uVar11 & 0xffffffff00000000 | (ulong)uVar19;
    uVar14 = (uint)cVar20;
    uVar13 = (uint)(uVar11 >> 0x20);
    if (cVar20 < '\0') {
      cVar20 = -(uVar13 < -uVar14);
    }
    else {
      cVar20 = CARRY4(uVar14,uVar13);
    }
    uVar15 = uVar14 + uVar13 + uVar21;
    uVar22 = uVar15 + uVar21;
    uVar23 = uVar22 + uVar21;
    uVar24 = uVar23 + uVar4;
    uVar25 = uVar24 - local_80;
    uVar26 = uVar25 - uVar6;
    uVar16 = uVar26 - uVar9;
    bVar12 = ((((CARRY4(uVar22,uVar21) +
                 CARRY4(uVar14 + uVar13,uVar21) + cVar20 + CARRY4(uVar15,uVar21) +
                CARRY4(uVar23,uVar4)) - (uVar24 < local_80)) - (uVar25 < uVar6)) - (uVar26 < uVar9))
             - (uVar16 < uVar10);
    bVar8 = 0;
    if ('\0' < (char)bVar12) {
      bVar8 = bVar12;
    }
    pmVar2[3] = CONCAT44(uVar16 - uVar10,uVar19);
    pmVar2[4] = (ulong)bVar8 | uVar7 & 0xffffffff00000000;
    if (9 < N->n * 2) {
      uVar7 = 8;
      do {
        uVar11 = 0xffffffff00000000;
        if ((uVar7 & 1) == 0) {
          uVar11 = 0xffffffff;
        }
        puVar1 = (ulong *)((long)pmVar2 + (uVar7 + 1 & 0xfffffffffffffffe) * 4);
        *puVar1 = *puVar1 & uVar11;
        uVar11 = uVar7 + 2;
        uVar7 = uVar7 + 1;
      } while (uVar11 < N->n * 2);
    }
    if ((char)bVar12 < '\0') {
      local_70.p[local_70.n - 1] = -(long)(char)bVar12;
      iVar27 = mbedtls_mpi_sub_abs(N,&local_70,N);
      if (iVar27 == 0) {
        N->s = -1;
      }
    }
  }
  return iVar5;
}

Assistant:

static int ecp_mod_p256( mbedtls_mpi *N )
{
    INIT( 256 );

    ADD(  8 ); ADD(  9 );
    SUB( 11 ); SUB( 12 ); SUB( 13 ); SUB( 14 );             NEXT; // A0

    ADD(  9 ); ADD( 10 );
    SUB( 12 ); SUB( 13 ); SUB( 14 ); SUB( 15 );             NEXT; // A1

    ADD( 10 ); ADD( 11 );
    SUB( 13 ); SUB( 14 ); SUB( 15 );                        NEXT; // A2

    ADD( 11 ); ADD( 11 ); ADD( 12 ); ADD( 12 ); ADD( 13 );
    SUB( 15 ); SUB(  8 ); SUB(  9 );                        NEXT; // A3

    ADD( 12 ); ADD( 12 ); ADD( 13 ); ADD( 13 ); ADD( 14 );
    SUB(  9 ); SUB( 10 );                                   NEXT; // A4

    ADD( 13 ); ADD( 13 ); ADD( 14 ); ADD( 14 ); ADD( 15 );
    SUB( 10 ); SUB( 11 );                                   NEXT; // A5

    ADD( 14 ); ADD( 14 ); ADD( 15 ); ADD( 15 ); ADD( 14 ); ADD( 13 );
    SUB(  8 ); SUB(  9 );                                   NEXT; // A6

    ADD( 15 ); ADD( 15 ); ADD( 15 ); ADD( 8 );
    SUB( 10 ); SUB( 11 ); SUB( 12 ); SUB( 13 );             LAST; // A7

cleanup:
    return( ret );
}